

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Sfm_DecPrepareVec(Vec_Int_t *vMap,int *pNodes,int nNodes,Vec_Int_t *vCut)

{
  int Entry;
  ulong uVar1;
  ulong uVar2;
  
  vCut->nSize = 0;
  uVar1 = 0;
  uVar2 = (ulong)(uint)nNodes;
  if (nNodes < 1) {
    uVar2 = uVar1;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    Entry = Vec_IntEntry(vMap,pNodes[uVar1]);
    Vec_IntPush(vCut,Entry);
  }
  return;
}

Assistant:

void Sfm_DecPrepareVec( Vec_Int_t * vMap, int * pNodes, int nNodes, Vec_Int_t * vCut )
{
    int i;
    Vec_IntClear( vCut );
    for ( i = 0; i < nNodes; i++ )
        Vec_IntPush( vCut, Vec_IntEntry(vMap, pNodes[i]) );    
}